

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

bool jpge::compress_image_to_jpeg_file_in_memory
               (void *pDstBuf,int *buf_size,int width,int height,int num_channels,uint8 *pImage_data
               ,params *comp_params)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint8 *pScanline;
  int i;
  uint pass_index;
  undefined1 local_3508 [8];
  jpeg_encoder dst_image;
  memory_stream dst_stream;
  uint8 *pImage_data_local;
  int num_channels_local;
  int height_local;
  int width_local;
  int *buf_size_local;
  void *pDstBuf_local;
  
  if ((pDstBuf == (void *)0x0) || (*buf_size == 0)) {
    pDstBuf_local._7_1_ = false;
  }
  else {
    memory_stream::memory_stream((memory_stream *)&dst_image.m_bits_in,pDstBuf,*buf_size);
    *buf_size = 0;
    jpeg_encoder::jpeg_encoder((jpeg_encoder *)local_3508);
    uVar2 = jpeg_encoder::init((jpeg_encoder *)local_3508,(EVP_PKEY_CTX *)&dst_image.m_bits_in);
    if ((uVar2 & 1) == 0) {
      pDstBuf_local._7_1_ = false;
    }
    else {
      pScanline._4_4_ = 0;
      while( true ) {
        uVar3 = jpeg_encoder::get_total_passes((jpeg_encoder *)local_3508);
        if (uVar3 <= pScanline._4_4_) break;
        for (pScanline._0_4_ = 0; (int)pScanline < height; pScanline._0_4_ = (int)pScanline + 1) {
          bVar1 = jpeg_encoder::process_scanline
                            ((jpeg_encoder *)local_3508,
                             pImage_data + (int)pScanline * width * num_channels);
          if (!bVar1) {
            pDstBuf_local._7_1_ = false;
            goto LAB_00126abe;
          }
        }
        bVar1 = jpeg_encoder::process_scanline((jpeg_encoder *)local_3508,(void *)0x0);
        if (!bVar1) {
          pDstBuf_local._7_1_ = false;
          goto LAB_00126abe;
        }
        pScanline._4_4_ = pScanline._4_4_ + 1;
      }
      jpeg_encoder::deinit((jpeg_encoder *)local_3508);
      uVar3 = memory_stream::get_size((memory_stream *)&dst_image.m_bits_in);
      *buf_size = uVar3;
      pDstBuf_local._7_1_ = true;
    }
LAB_00126abe:
    jpeg_encoder::~jpeg_encoder((jpeg_encoder *)local_3508);
    memory_stream::~memory_stream((memory_stream *)&dst_image.m_bits_in);
  }
  return pDstBuf_local._7_1_;
}

Assistant:

bool compress_image_to_jpeg_file_in_memory(void *pDstBuf, int &buf_size, int width, int height, int num_channels, const uint8 *pImage_data, const params &comp_params)
{
   if ((!pDstBuf) || (!buf_size))
      return false;

   memory_stream dst_stream(pDstBuf, buf_size);

   buf_size = 0;

   jpge::jpeg_encoder dst_image;
   if (!dst_image.init(&dst_stream, width, height, num_channels, comp_params))
      return false;

   for (uint pass_index = 0; pass_index < dst_image.get_total_passes(); pass_index++)
   {
     for (int i = 0; i < height; i++)
     {
        const uint8* pScanline = pImage_data + i * width * num_channels;
        if (!dst_image.process_scanline(pScanline))
           return false;
     }
     if (!dst_image.process_scanline(NULL))
        return false;
   }

   dst_image.deinit();

   buf_size = dst_stream.get_size();
   return true;
}